

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<88>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  int b;
  void *__s;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int keybit;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 in_XMM7_Qb;
  uint h2;
  uint h1;
  Blob<88> key;
  uint local_98;
  uint local_94;
  uint local_80;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  Rand local_58;
  undefined7 local_40;
  undefined4 uStack_39;
  
  local_58.x = 0x88e23b73;
  local_58.y = 0x11310f6c;
  local_58.z = 0x18847f4;
  local_58.w = 0x1142a2ba;
  local_40 = 0;
  uStack_39 = 0;
  __s = operator_new(0x160000);
  uVar5 = 0;
  memset(__s,0,0x160000);
  lVar10 = (long)__s + 0x10;
  do {
    if ((uVar5 & 7) == 0) {
      putchar(0x2e);
    }
    if (0 < reps) {
      iVar13 = 0;
      do {
        Rand::rand_p(&local_58,&local_40,0xb);
        (*hash)(&local_40,0xb,0,&local_7c);
        flipbit(&local_40,0xb,(uint32_t)uVar5);
        (*hash)(&local_40,0xb,0,&local_80);
        lVar3 = -0x1f;
        lVar7 = 0;
        lVar4 = lVar10;
        do {
          uVar6 = (uint)lVar7;
          lVar7 = lVar7 + 1;
          lVar8 = lVar3;
          lVar9 = lVar4;
          do {
            piVar1 = (int *)(lVar9 + (ulong)(((local_80 ^ local_7c) >> (uVar6 & 0x1f) & 1) +
                                            ((local_80 ^ local_7c) >> ((uint)lVar8 & 0x1f) & 1) * 2)
                                     * 4);
            *piVar1 = *piVar1 + 1;
            lVar9 = lVar9 + 0x10;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0);
          lVar4 = lVar4 + 0x210;
          lVar3 = lVar3 + 1;
        } while (lVar7 != 0x1f);
        iVar13 = iVar13 + 1;
      } while (iVar13 != reps);
    }
    uVar5 = uVar5 + 1;
    lVar10 = lVar10 + 0x4000;
  } while (uVar5 != 0x58);
  putchar(10);
  lVar10 = (long)__s + 0x10;
  auVar14 = ZEXT864(0) << 0x40;
  uVar2 = 1;
  auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar12 = 0;
  local_98 = 0;
  local_94 = 0;
  uVar5 = 0;
  do {
    local_78 = uVar5 + 1;
    local_70 = uVar2;
    local_68 = lVar10;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar5 & 0xffffffff,uVar2 & 0xffffffff);
        auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar14 = ZEXT864(auVar14._0_8_);
      }
      uVar11 = 0;
      local_60 = lVar10;
      do {
        auVar17 = ZEXT864(0) << 0x40;
        lVar4 = 0;
        do {
          auVar15._0_8_ = (double)*(int *)(lVar10 + lVar4 * 4) / (double)(reps / 2);
          auVar15._8_8_ = in_XMM7_Qb;
          auVar15 = vfmadd213sd_fma(auVar15,auVar18._0_16_,auVar19._0_16_);
          auVar15 = vandpd_avx(auVar15,auVar20._0_16_);
          auVar15 = vmaxsd_avx(auVar15,auVar17._0_16_);
          auVar17 = ZEXT1664(auVar15);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        dVar16 = auVar15._0_8_;
        if (auVar14._0_8_ < dVar16) {
          uVar12 = uVar11 & 0xffffffff;
          auVar14 = ZEXT1664(auVar15);
          local_98 = (uint)uVar5;
          local_94 = (uint)uVar2;
        }
        if (verbose) {
          iVar13 = 0x2e;
          if ((0.01 <= dVar16) && (iVar13 = 0x6f, 0.05 <= dVar16)) {
            iVar13 = (uint)(0.33 <= dVar16) * 9 + 0x4f;
          }
          putchar(iVar13);
          auVar14 = ZEXT864(auVar14._0_8_);
          auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x4000;
      } while (uVar11 != 0x58);
      if (verbose) {
        putchar(10);
        auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar14 = ZEXT864(auVar14._0_8_);
      }
      lVar4 = local_68;
      uVar2 = uVar2 + 1;
      lVar10 = local_60 + 0x10;
    } while (uVar2 != 0x20);
    if (verbose) {
      iVar13 = 100;
      do {
        putchar(0x2d);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      putchar(10);
      auVar14 = ZEXT864(auVar14._0_8_);
      auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar2 = local_70 + 1;
    lVar10 = lVar4 + 0x210;
    uVar5 = local_78;
  } while (local_78 != 0x1f);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar12,(ulong)local_98,(ulong)local_94);
  operator_delete(__s);
  return auVar14._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}